

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
          (vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *__return_storage_ptr__,
          JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *this)

{
  pointer pPVar1;
  pointer this_00;
  PsbtMapDataStruct data;
  PsbtMapDataStruct local_90;
  
  (__return_storage_ptr__->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (this->super_JsonVector<cfd::api::json::PsbtMapData>).
           super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
           super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::api::json::PsbtMapData>).
                 super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                 .
                 super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1
      ) {
    cfd::api::json::PsbtMapData::ConvertToStruct(&local_90,this_00);
    ::std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::push_back
              (__return_storage_ptr__,&local_90);
    PsbtMapDataStruct::~PsbtMapDataStruct(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }